

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncat_s.c
# Opt level: O2

errno_t strncat_s(char *s1,rsize_t s1max,char *s2,rsize_t n)

{
  char cVar1;
  char *pcVar2;
  rsize_t rVar3;
  bool bVar4;
  
  if ((((s1 == (char *)0x0) || (s1max == 0)) || (s2 == (char *)0x0)) || ((long)(n | s1max) < 0)) {
LAB_00103295:
    if ((s1 != (char *)0x0) && (0 < (long)s1max)) {
      *s1 = '\0';
    }
LAB_001032a2:
    (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
    return 0x16;
  }
  pcVar2 = s1;
  rVar3 = s1max - 1;
LAB_0010323a:
  s1max = rVar3;
  if (*pcVar2 == '\0') {
    rVar3 = 0;
    while( true ) {
      if (n == rVar3) {
        pcVar2[rVar3] = '\0';
        return 0;
      }
      if (((s1max + 1 == rVar3) || (pcVar2 + rVar3 == s2)) || (s2 + rVar3 == s1)) break;
      cVar1 = s2[rVar3];
      pcVar2[rVar3] = cVar1;
      rVar3 = rVar3 + 1;
      if (cVar1 == '\0') {
        return 0;
      }
    }
    s1max = s1max - rVar3;
    goto LAB_00103295;
  }
  if (s1max != 0) goto code_r0x00103245;
  goto LAB_001032a2;
code_r0x00103245:
  bVar4 = pcVar2 == s2;
  pcVar2 = pcVar2 + 1;
  rVar3 = s1max - 1;
  if (bVar4) goto LAB_00103295;
  goto LAB_0010323a;
}

Assistant:

errno_t strncat_s( char * _PDCLIB_restrict s1, rsize_t s1max, const char * _PDCLIB_restrict s2, rsize_t n )
{
    char * dest = s1;
    const char * src = s2;

    if ( s1 != NULL && s2 != NULL && s1max <= RSIZE_MAX && n <= RSIZE_MAX && s1max != 0 )
    {
        while ( *dest )
        {
            if ( --s1max == 0 || dest++ == s2 )
            {
                goto runtime_constraint_violation;
            }
        }

        do
        {
            if ( n-- == 0 )
            {
                *dest = '\0';
                return 0;
            }

            if ( s1max-- == 0 || dest == s2 || src == s1 )
            {
                goto runtime_constraint_violation;
            }
        } while ( ( *dest++ = *src++ ) );

        return 0;
    }

runtime_constraint_violation:

    if ( s1 != NULL && s1max > 0 && s1max <= RSIZE_MAX )
    {
        s1[0] = '\0';
    }

    _PDCLIB_constraint_handler( _PDCLIB_CONSTRAINT_VIOLATION( _PDCLIB_EINVAL ) );
    return _PDCLIB_EINVAL;
}